

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

ssize_t __thiscall B000FFReadWriter::write(B000FFReadWriter *this,int __fd,void *__buf,size_t __n)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  ssize_t in_RAX;
  _Base_ptr p_Var3;
  undefined4 extraout_var;
  undefined8 *puVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  uint32_t size;
  uint uVar9;
  undefined4 in_register_00000034;
  int iVar10;
  void *pvVar11;
  
  if (__buf != (void *)0x0) {
    p_Var1 = &(this->_blockmap)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var3 = (this->_curblk)._M_node;
      if ((_Rb_tree_header *)p_Var3 == p_Var1) {
LAB_0011876a:
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar7 = "b000ff: out of space";
LAB_0011878e:
        *puVar4 = pcVar7;
        __cxa_throw(puVar4,&char_const*::typeinfo,0);
      }
      uVar9 = this->_bpos;
      uVar8 = *(uint *)&p_Var3[1]._M_left;
      if (*(int *)((long)&p_Var3[1]._M_left + 4) + uVar8 <= uVar9) {
        (*(this->super_ReadWriter)._vptr_ReadWriter[4])(this);
        p_Var3 = (this->_curblk)._M_node;
        if ((_Rb_tree_header *)p_Var3 == p_Var1) goto LAB_0011876a;
        uVar9 = this->_bpos;
        uVar8 = *(uint *)&p_Var3[1]._M_left;
      }
      if (uVar9 < uVar8) {
        if (1 < g_verbose) {
          printf("attempted write in b00 gap: %08x [ nextbk=%08x-%08x]\n",(ulong)uVar9,(ulong)uVar8,
                 (ulong)(*(int *)((long)&p_Var3[1]._M_left + 4) + uVar8));
          p_Var3 = (this->_curblk)._M_node;
        }
        if (p_Var3 == (this->_blockmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(8);
          pcVar7 = "b000ff: can\'t write before first block";
          goto LAB_0011878e;
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_decrement(p_Var3);
        (this->_curblk)._M_node = p_Var3;
        iVar10 = *(int *)((long)&p_Var3[1]._M_left + 4) + *(int *)&p_Var3[1]._M_left;
        uVar9 = this->_blocksize;
        uVar5 = this->_bpos - iVar10;
        iVar6 = uVar5 - uVar5 % uVar9;
        size = (uVar8 - iVar10) + iVar6;
        if (uVar9 <= size) {
          size = uVar9;
        }
        allocblock(this,iVar6 + iVar10,size);
        (*(this->super_ReadWriter)._vptr_ReadWriter[4])(this,(ulong)this->_bpos);
        p_Var3 = (this->_curblk)._M_node;
        uVar9 = this->_bpos;
        uVar8 = *(uint *)&p_Var3[1]._M_left;
      }
      *(undefined1 *)&p_Var3[1]._M_right = 1;
      pvVar11 = (void *)((ulong)*(uint *)((long)&p_Var3[1]._M_left + 4) - (ulong)(uVar9 - uVar8));
      if (__buf <= pvVar11) {
        pvVar11 = __buf;
      }
      peVar2 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar2->_vptr_ReadWriter[4])
                (peVar2,(long)&(p_Var3[1]._M_parent)->_M_color + (ulong)(uVar9 - uVar8));
      peVar2 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar6 = (*peVar2->_vptr_ReadWriter[3])(peVar2,CONCAT44(in_register_00000034,__fd),pvVar11);
      in_RAX = CONCAT44(extraout_var,iVar6);
      this->_bpos = this->_bpos + (int)pvVar11;
      __buf = (void *)((long)__buf - (long)pvVar11);
    } while (__buf != (void *)0x0);
  }
  return in_RAX;
}

Assistant:

virtual void write(const uint8_t *p, size_t n)
    {
        while (n) {
            if (_curblk==_blockmap.end())
                throw "b000ff: out of space";

            // cur pos is after cur block -> move to next
            if (_bpos >= _curblk->second.endblkofs()) {
                setpos(_bpos);

                if (_curblk==_blockmap.end())
                    throw "b000ff: out of space";
            }

            // cur pos is before current block ( and after prev block )
            if (_bpos < _curblk->second.blockofs) {
                uint32_t nextstart= _curblk->second.blockofs;

                if (g_verbose>1)
                    printf("attempted write in b00 gap: %08x [ nextbk=%08x-%08x]\n", _bpos, nextstart, _curblk->second.endblkofs());

                if (_curblk==_blockmap.begin())
                    throw "b000ff: can't write before first block";

                _curblk--;
                uint32_t prevend= _curblk->second.endblkofs();
                int n= (_bpos-prevend)/_blocksize;
    
//              printf("alloccing b00 block: prev=%08x, next=%08x -> n=%d: ofs=%08x, size=%08x\n", 
//                      prevend, nextstart, n, prevend+n*_blocksize, std::min(_blocksize, nextstart-prevend+n*_blocksize));
                allocblock(prevend+n*_blocksize, std::min(_blocksize, nextstart-prevend+n*_blocksize));
                setpos(_bpos);
            }

            _curblk->second.modified= true;

            size_t want= std::min(n, _curblk->second.size-size_t(_bpos-_curblk->second.blockofs));

            _r->setpos(_curblk->second.block2file(_bpos));
            _r->write(p, want);

            _bpos += want;
            n -= want;
        }
    }